

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_decl.cc
# Opt level: O0

void __thiscall Decl::~Decl(Decl *this)

{
  bool bVar1;
  reference ppAVar2;
  undefined8 *in_RDI;
  iterator delete_list_i;
  vector<Attr_*,_std::allocator<Attr_*>_> *in_stack_ffffffffffffffc8;
  void *pvVar3;
  Attr *in_stack_ffffffffffffffd0;
  vector<Attr_*,_std::allocator<Attr_*>_> *this_00;
  __normal_iterator<Attr_**,_std::vector<Attr_*,_std::allocator<Attr_*>_>_> local_10 [2];
  
  *in_RDI = &PTR__Decl_00179b68;
  this_00 = (vector<Attr_*,_std::allocator<Attr_*>_> *)in_RDI[10];
  if (this_00 != (vector<Attr_*,_std::allocator<Attr_*>_> *)0x0) {
    ID::~ID((ID *)in_stack_ffffffffffffffd0);
    operator_delete(this_00,0x78);
  }
  if (in_RDI[0xc] != 0) {
    local_10[0]._M_current =
         (Attr **)std::vector<Attr_*,_std::allocator<Attr_*>_>::begin(in_stack_ffffffffffffffc8);
    while( true ) {
      std::vector<Attr_*,_std::allocator<Attr_*>_>::end(in_stack_ffffffffffffffc8);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<Attr_**,_std::vector<Attr_*,_std::allocator<Attr_*>_>_>
                          *)in_stack_ffffffffffffffd0,
                         (__normal_iterator<Attr_**,_std::vector<Attr_*,_std::allocator<Attr_*>_>_>
                          *)in_stack_ffffffffffffffc8);
      if (!bVar1) break;
      ppAVar2 = __gnu_cxx::__normal_iterator<Attr_**,_std::vector<Attr_*,_std::allocator<Attr_*>_>_>
                ::operator*(local_10);
      in_stack_ffffffffffffffd0 = *ppAVar2;
      if (in_stack_ffffffffffffffd0 != (Attr *)0x0) {
        (*(in_stack_ffffffffffffffd0->super_DataDepElement)._vptr_DataDepElement[1])();
      }
      __gnu_cxx::__normal_iterator<Attr_**,_std::vector<Attr_*,_std::allocator<Attr_*>_>_>::
      operator++(local_10);
    }
  }
  pvVar3 = (void *)in_RDI[0xc];
  if (pvVar3 != (void *)0x0) {
    std::vector<Attr_*,_std::allocator<Attr_*>_>::~vector(this_00);
    operator_delete(pvVar3,0x18);
  }
  in_RDI[0xc] = 0;
  Object::~Object((Object *)in_stack_ffffffffffffffd0);
  return;
}

Assistant:

Decl::~Decl()
	{
	delete id_;
	delete_list(AttrList, attrlist_);
	}